

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket-rpc.c++
# Opt level: O1

Promise<void> __thiscall
capnp::WebSocketMessageStream::writeMessage
          (WebSocketMessageStream *this,ArrayPtr<const_int> fds,
          ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  undefined1 node [8];
  capnp *pcVar1;
  size_t sVar2;
  ArrayPtr<const_capnp::word> *pAVar3;
  ArrayPtr<const_capnp::word> *in_R9;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_01;
  Own<kj::VectorOutputStream,_std::nullptr_t> stream;
  undefined1 local_40 [8];
  VectorOutputStream *local_38;
  capnp *local_30;
  
  pAVar3 = segments.ptr;
  segments_01.size_ = fds.size_;
  segments_01.ptr = in_R9;
  sVar2 = computeSerializedSizeInWords((capnp *)segments.size_,segments_01);
  local_40 = (undefined1  [8])(sVar2 << 3);
  kj::heap<kj::VectorOutputStream,unsigned_long>((kj *)&local_38,(unsigned_long *)local_40);
  segments_00.size_ = (size_t)pAVar3;
  segments_00.ptr = in_R9;
  capnp::writeMessage(local_30,(OutputStream *)segments.size_,segments_00);
  (**(code **)**(undefined8 **)(fds.ptr + 2))
            (local_40,*(undefined8 **)(fds.ptr + 2),*(long *)(local_30 + 8),
             *(long *)(local_30 + 0x20) - *(long *)(local_30 + 8));
  kj::Promise<void>::attach<kj::Own<kj::VectorOutputStream,decltype(nullptr)>>
            ((Promise<void> *)this,(Own<kj::VectorOutputStream,_std::nullptr_t> *)local_40);
  node = local_40;
  if (local_40 != (undefined1  [8])0x0) {
    local_40 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  pcVar1 = local_30;
  if (local_30 != (capnp *)0x0) {
    local_30 = (capnp *)0x0;
    (**(local_38->super_BufferedOutputStream).super_OutputStream._vptr_OutputStream)
              (local_38,pcVar1 + *(long *)(*(long *)pcVar1 + -0x10));
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> WebSocketMessageStream::writeMessage(
    kj::ArrayPtr<const int> fds,
    kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  // TODO(perf): Right now the WebSocket interface only supports send() for
  // contiguous arrays, so we need to copy the whole message into a new buffer
  // in order to send it, whereas ideally we could just write each segment
  // (and the segment table) in sequence. Perhaps we should extend the WebSocket
  // interface to be able to send an ArrayPtr<ArrayPtr<byte>> as one binary
  // message, and then use that to avoid an extra copy here.

  auto stream = kj::heap<kj::VectorOutputStream>(
      computeSerializedSizeInWords(segments) * sizeof(word));
  capnp::writeMessage(*stream, segments);
  auto arrayPtr = stream->getArray();
  return socket.send(arrayPtr).attach(kj::mv(stream));
}